

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

int skill_crosstrain_bonus(int skill)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  
  if (skill - 0x1eU < 0xffffffe3) {
    return 1;
  }
  uVar1 = (ulong)(uint)skill;
  iVar2 = 1;
  iVar4 = 2;
  do {
    iVar3 = iVar4;
    if (iVar3 + 2U < 2) goto LAB_00270891;
    iVar4 = iVar3 + -1;
  } while ((int)(uint)u.weapon_skills[uVar1].advance < 100 << ((byte)iVar3 & 0x1f));
  iVar2 = iVar3 + 2;
LAB_00270891:
  iVar3 = (int)u.weapon_skills[uVar1].skill;
  iVar4 = 0;
  for (lVar5 = 0; lVar5 != 0x1d; lVar5 = lVar5 + 1) {
    if (((uVar1 - 1 != lVar5) &&
        ((weapon_skill_groups[skill - 1] & weapon_skill_groups[lVar5]) != 0)) &&
       (iVar6 = (int)u.weapon_skills[lVar5 + 1].skill, iVar4 <= iVar6)) {
      iVar4 = iVar6;
    }
  }
  if (iVar3 < iVar2) {
    iVar3 = iVar2;
  }
  iVar2 = 0;
  if (0 < iVar4 - iVar3) {
    iVar2 = iVar4 - iVar3;
  }
  return iVar2 + 1;
}

Assistant:

static int skill_crosstrain_bonus(int skill)
{
    int base_skill, highest_skill, i;

    if (skill < P_FIRST_WEAPON || skill > P_LAST_WEAPON)
	return 1;

    /* find greatest skill level based solely on training points */
    base_skill = P_UNSKILLED;
    for (i = P_EXPERT; i > P_UNSKILLED; i--) {
	/* getting the training points for the _current_ level is awkward */
	if (P_ADVANCE(skill) >= practice_needed_to_advance(skill, i - 1)) {
	    base_skill = i;
	    break;
	}
    }
    /* if advancement level exceeds points (e.g. wizard mode), catch it too */
    if (base_skill < P_SKILL(skill))
	base_skill = P_SKILL(skill);

    /* find highest related weapon skill advancement */
    highest_skill = P_ISRESTRICTED;
    for (i = P_FIRST_WEAPON; i <= P_LAST_WEAPON; i++) {
	if (i == skill)
	    continue;
	if ((weapon_skill_groups[skill - P_FIRST_WEAPON] &
	     weapon_skill_groups[i - P_FIRST_WEAPON]) == 0)
	    continue;
	if (P_SKILL(i) > highest_skill)
	    highest_skill = P_SKILL(i);
    }

    return max(highest_skill - base_skill + 1, 1);
}